

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoNight_x86.h
# Opt level: O1

void xmrig::cryptonight_triple_hash<false>
               (uint8_t *input,size_t size,uint8_t *output,cryptonight_ctx **ctx,uint64_t height,
               uint64_t extra_iters)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  cryptonight_ctx *pcVar6;
  cryptonight_ctx *pcVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  cryptonight_ctx *pcVar10;
  uint8_t *puVar11;
  undefined1 auVar12 [16];
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  size_t i;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  undefined1 auVar43 [16];
  long lVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  ulong uVar47;
  ulong uVar48;
  long lVar49;
  long lVar50;
  undefined1 auVar51 [16];
  double dVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  long lVar57;
  undefined1 auVar58 [16];
  long lVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  ulong local_168;
  
  lVar23 = 0;
  do {
    pcVar6 = ctx[lVar23];
    keccak(input,(int)size,pcVar6->state,200);
    cn_explode_scratchpad<false>((__m128i *)pcVar6,(__m128i *)pcVar6->memory);
    lVar23 = lVar23 + 1;
    input = input + size;
  } while (lVar23 != 3);
  pcVar6 = *ctx;
  pcVar7 = ctx[1];
  puVar8 = pcVar6->memory;
  puVar9 = pcVar7->memory;
  pcVar10 = ctx[2];
  puVar11 = pcVar10->memory;
  local_168 = *(ulong *)(pcVar6->state + 0x60);
  lVar23 = *(long *)(pcVar6->state + 0x68);
  auVar55 = *(undefined1 (*) [16])pcVar6->state;
  auVar53 = *(undefined1 (*) [16])(pcVar6->state + 0x10);
  auVar43 = *(undefined1 (*) [16])(pcVar6->state + 0x20);
  auVar46 = *(undefined1 (*) [16])(pcVar6->state + 0x30);
  auVar51 = *(undefined1 (*) [16])(pcVar6->state + 0x40);
  auVar54 = *(undefined1 (*) [16])(pcVar6->state + 0x50);
  uVar35 = *(ulong *)(pcVar7->state + 0x60);
  lVar37 = *(long *)(pcVar7->state + 0x68);
  auVar45 = *(undefined1 (*) [16])pcVar7->state;
  auVar12 = *(undefined1 (*) [16])(pcVar7->state + 0x10);
  auVar56 = *(undefined1 (*) [16])(pcVar7->state + 0x20);
  auVar60 = *(undefined1 (*) [16])(pcVar7->state + 0x30);
  uVar19 = *(ulong *)(pcVar7->state + 0x40);
  uVar31 = *(ulong *)(pcVar7->state + 0x48);
  uVar38 = *(ulong *)(pcVar7->state + 0x50);
  uVar39 = *(ulong *)(pcVar7->state + 0x58);
  uVar17 = *(ulong *)(pcVar10->state + 0x60);
  lVar32 = *(long *)(pcVar10->state + 0x68);
  auVar5 = *(undefined1 (*) [16])pcVar10->state;
  auVar4 = *(undefined1 (*) [16])(pcVar10->state + 0x10);
  auVar58 = *(undefined1 (*) [16])(pcVar10->state + 0x20);
  auVar62 = *(undefined1 (*) [16])(pcVar10->state + 0x30);
  uVar29 = *(ulong *)(pcVar10->state + 0x40);
  uVar21 = *(ulong *)(pcVar10->state + 0x48);
  uVar27 = *(ulong *)(pcVar10->state + 0x50);
  uVar18 = *(ulong *)(pcVar10->state + 0x58);
  fesetround(0x400);
  uVar25 = extra_iters + 0x40000 >> 1 & 0xffffffff;
  if (uVar25 != 0) {
    auVar58 = auVar58 ^ auVar5;
    auVar56 = auVar56 ^ auVar45;
    auVar43 = auVar43 ^ auVar55;
    uVar22 = auVar43._0_8_;
    uVar20 = auVar56._0_8_;
    uVar16 = auVar58._0_8_;
    auVar46 = auVar46 ^ auVar53;
    auVar54 = auVar54 ^ auVar51;
    auVar60 = auVar60 ^ auVar12;
    auVar62 = auVar62 ^ auVar4;
    uVar19 = uVar38 ^ uVar19;
    uVar31 = uVar39 ^ uVar31;
    uVar38 = uVar27 ^ uVar29;
    uVar39 = uVar18 ^ uVar21;
    do {
      auVar45 = auVar46;
      uVar22 = uVar22 & 0xffff0;
      uVar20 = uVar20 & 0xffff0;
      uVar16 = uVar16 & 0xffff0;
      lVar13 = *(long *)((long)(puVar8 + (uVar22 ^ 0x30)) + 8);
      auVar46 = *(undefined1 (*) [16])(puVar8 + uVar22);
      auVar4 = *(undefined1 (*) [16])(puVar9 + uVar20);
      auVar5 = *(undefined1 (*) [16])(puVar11 + uVar16);
      lVar57 = *(long *)(puVar8 + (uVar22 ^ 0x10));
      lVar59 = *(long *)((long)(puVar8 + (uVar22 ^ 0x10)) + 8);
      lVar14 = *(long *)(puVar8 + (uVar22 ^ 0x20));
      lVar15 = *(long *)((long)(puVar8 + (uVar22 ^ 0x20)) + 8);
      *(long *)(puVar8 + (uVar22 ^ 0x10)) = *(long *)(puVar8 + (uVar22 ^ 0x30)) + auVar54._0_8_;
      *(long *)((long)(puVar8 + (uVar22 ^ 0x10)) + 8) = lVar13 + auVar54._8_8_;
      *(long *)(puVar8 + (uVar22 ^ 0x20)) = lVar57 + auVar45._0_8_;
      *(long *)((long)(puVar8 + (uVar22 ^ 0x20)) + 8) = lVar59 + auVar45._8_8_;
      lVar42 = auVar43._0_8_;
      lVar44 = auVar43._8_8_;
      *(long *)(puVar8 + (uVar22 ^ 0x30)) = lVar14 + lVar42;
      *(long *)((long)(puVar8 + (uVar22 ^ 0x30)) + 8) = lVar15 + lVar44;
      auVar46 = aesenc(auVar46,auVar43);
      *(undefined1 (*) [16])(puVar8 + uVar22) = auVar46 ^ auVar45;
      lVar13 = *(long *)((long)(puVar9 + (uVar20 ^ 0x30)) + 8);
      lVar57 = *(long *)(puVar9 + (uVar20 ^ 0x10));
      lVar59 = *(long *)((long)(puVar9 + (uVar20 ^ 0x10)) + 8);
      lVar14 = *(long *)(puVar9 + (uVar20 ^ 0x20));
      lVar15 = *(long *)((long)(puVar9 + (uVar20 ^ 0x20)) + 8);
      *(ulong *)(puVar9 + (uVar20 ^ 0x10)) = *(long *)(puVar9 + (uVar20 ^ 0x30)) + uVar19;
      *(ulong *)((long)(puVar9 + (uVar20 ^ 0x10)) + 8) = lVar13 + uVar31;
      uVar47 = auVar60._0_8_;
      uVar48 = auVar60._8_8_;
      *(ulong *)(puVar9 + (uVar20 ^ 0x20)) = lVar57 + uVar47;
      *(ulong *)((long)(puVar9 + (uVar20 ^ 0x20)) + 8) = lVar59 + uVar48;
      lVar49 = auVar56._0_8_;
      lVar50 = auVar56._8_8_;
      *(long *)(puVar9 + (uVar20 ^ 0x30)) = lVar14 + lVar49;
      *(long *)((long)(puVar9 + (uVar20 ^ 0x30)) + 8) = lVar15 + lVar50;
      auVar61 = aesenc(auVar4,auVar56);
      *(undefined1 (*) [16])(puVar9 + uVar20) = auVar61 ^ auVar60;
      lVar13 = *(long *)((long)(puVar11 + (uVar16 ^ 0x30)) + 8);
      lVar57 = *(long *)(puVar11 + (uVar16 ^ 0x10));
      lVar59 = *(long *)((long)(puVar11 + (uVar16 ^ 0x10)) + 8);
      lVar14 = *(long *)(puVar11 + (uVar16 ^ 0x20));
      lVar15 = *(long *)((long)(puVar11 + (uVar16 ^ 0x20)) + 8);
      *(ulong *)(puVar11 + (uVar16 ^ 0x10)) = *(long *)(puVar11 + (uVar16 ^ 0x30)) + uVar38;
      *(ulong *)((long)(puVar11 + (uVar16 ^ 0x10)) + 8) = lVar13 + uVar39;
      uVar40 = auVar62._0_8_;
      uVar41 = auVar62._8_8_;
      *(ulong *)(puVar11 + (uVar16 ^ 0x20)) = lVar57 + uVar40;
      *(ulong *)((long)(puVar11 + (uVar16 ^ 0x20)) + 8) = lVar59 + uVar41;
      lVar57 = auVar58._0_8_;
      lVar59 = auVar58._8_8_;
      *(long *)(puVar11 + (uVar16 ^ 0x30)) = lVar14 + lVar57;
      *(long *)((long)(puVar11 + (uVar16 ^ 0x30)) + 8) = lVar15 + lVar59;
      auVar63 = aesenc(auVar5,auVar58);
      *(undefined1 (*) [16])(puVar11 + uVar16) = auVar63 ^ auVar62;
      uVar27 = auVar46._0_8_;
      uVar26 = uVar27 & 0xffff0;
      uVar20 = lVar23 << 0x20 ^ local_168 ^ *(ulong *)(puVar8 + uVar26);
      uVar29 = (ulong)(auVar46._0_4_ + (int)lVar23 * 2 & 0x7ffffffe) | 0x80000001;
      local_168 = auVar46._8_8_ % uVar29 << 0x20 | auVar46._8_8_ / uVar29 & 0xffffffff;
      dVar52 = SQRT((double)(local_168 + uVar27 >> 0xc | 0x3ff0000000000000));
      uVar36 = auVar61._0_8_;
      uVar33 = auVar63._0_8_;
      uVar29 = (ulong)dVar52 >> 0x14;
      uVar21 = (ulong)dVar52 >> 0x13;
      uVar30 = uVar36 & 0xffff0;
      uVar34 = uVar33 & 0xffff0;
      lVar23 = uVar21 + (((uVar21 - uVar29) + -0x3fdffffffff) * (uVar29 - 0x3fe00000000) <
                        local_168 + uVar27);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = uVar20;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar27;
      uVar22 = SUB168(auVar60 * auVar4,8);
      uVar16 = SUB168(auVar60 * auVar4,0);
      uVar29 = *(ulong *)(puVar8 + (uVar26 ^ 0x20));
      uVar21 = *(ulong *)((long)(puVar8 + (uVar26 ^ 0x20)) + 8);
      uVar27 = *(ulong *)(puVar8 + (uVar26 ^ 0x10));
      uVar18 = *(ulong *)((long)(puVar8 + (uVar26 ^ 0x10)) + 8);
      lVar13 = *(long *)((long)(puVar8 + (uVar26 ^ 0x30)) + 8);
      uVar28 = lVar37 << 0x20 ^ uVar35 ^ *(ulong *)(puVar9 + uVar30);
      uVar24 = lVar32 << 0x20 ^ uVar17 ^ *(ulong *)(puVar11 + uVar34);
      uVar1 = *(undefined8 *)(puVar8 + uVar26 + 8);
      uVar2 = *(undefined8 *)(puVar9 + uVar30 + 8);
      uVar3 = *(undefined8 *)(puVar11 + uVar34 + 8);
      *(long *)(puVar8 + (uVar26 ^ 0x10)) = auVar54._0_8_ + *(long *)(puVar8 + (uVar26 ^ 0x30));
      *(long *)((long)(puVar8 + (uVar26 ^ 0x10)) + 8) = auVar54._8_8_ + lVar13;
      *(ulong *)(puVar8 + (uVar26 ^ 0x20)) = (uVar22 ^ uVar27) + auVar45._0_8_;
      *(ulong *)((long)(puVar8 + (uVar26 ^ 0x20)) + 8) = (uVar16 ^ uVar18) + auVar45._8_8_;
      auVar51._0_8_ = (uVar29 ^ uVar22) + lVar42;
      auVar51._8_8_ = (uVar21 ^ uVar16) + lVar44;
      *(ulong *)(puVar8 + (uVar26 ^ 0x30)) = uVar29 + lVar42;
      *(ulong *)((long)(puVar8 + (uVar26 ^ 0x30)) + 8) = uVar21 + lVar44;
      *(undefined1 (*) [16])(puVar8 + uVar26) = auVar51;
      uVar35 = (ulong)(auVar61._0_4_ + (int)lVar37 * 2 & 0x7ffffffe) | 0x80000001;
      uVar35 = auVar61._8_8_ % uVar35 << 0x20 | auVar61._8_8_ / uVar35 & 0xffffffff;
      dVar52 = SQRT((double)(uVar35 + uVar36 >> 0xc | 0x3ff0000000000000));
      uVar29 = (ulong)dVar52 >> 0x13;
      uVar17 = (ulong)dVar52 >> 0x14;
      lVar37 = uVar29 + (((uVar29 - uVar17) + -0x3fdffffffff) * (uVar17 - 0x3fe00000000) <
                        uVar35 + uVar36);
      auVar54._8_8_ = 0;
      auVar54._0_8_ = uVar28;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar36;
      uVar16 = SUB168(auVar54 * auVar5,8);
      uVar18 = SUB168(auVar54 * auVar5,0);
      uVar17 = *(ulong *)(puVar9 + (uVar30 ^ 0x20));
      uVar29 = *(ulong *)((long)(puVar9 + (uVar30 ^ 0x20)) + 8);
      uVar21 = *(ulong *)(puVar9 + (uVar30 ^ 0x10));
      uVar27 = *(ulong *)((long)(puVar9 + (uVar30 ^ 0x10)) + 8);
      lVar13 = *(long *)((long)(puVar9 + (uVar30 ^ 0x30)) + 8);
      *(ulong *)(puVar9 + (uVar30 ^ 0x10)) = uVar19 + *(long *)(puVar9 + (uVar30 ^ 0x30));
      *(ulong *)((long)(puVar9 + (uVar30 ^ 0x10)) + 8) = uVar31 + lVar13;
      *(ulong *)(puVar9 + (uVar30 ^ 0x20)) = (uVar16 ^ uVar21) + uVar47;
      *(ulong *)((long)(puVar9 + (uVar30 ^ 0x20)) + 8) = (uVar18 ^ uVar27) + uVar48;
      *(ulong *)(puVar9 + (uVar30 ^ 0x30)) = uVar17 + lVar49;
      *(ulong *)((long)(puVar9 + (uVar30 ^ 0x30)) + 8) = uVar29 + lVar50;
      auVar55._0_8_ = (uVar17 ^ uVar16) + lVar49;
      auVar55._8_8_ = (uVar29 ^ uVar18) + lVar50;
      *(undefined1 (*) [16])(puVar9 + uVar30) = auVar55;
      uVar17 = (ulong)(auVar63._0_4_ + (int)lVar32 * 2 & 0x7ffffffe) | 0x80000001;
      uVar17 = auVar63._8_8_ % uVar17 << 0x20 | auVar63._8_8_ / uVar17 & 0xffffffff;
      dVar52 = SQRT((double)(uVar17 + uVar33 >> 0xc | 0x3ff0000000000000));
      auVar43._8_8_ = uVar1;
      auVar43._0_8_ = uVar20;
      uVar19 = (ulong)dVar52 >> 0x14;
      uVar31 = (ulong)dVar52 >> 0x13;
      auVar43 = auVar43 ^ auVar51;
      lVar32 = uVar31 + (((uVar31 - uVar19) + -0x3fdffffffff) * (uVar19 - 0x3fe00000000) <
                        uVar17 + uVar33);
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar24;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar33;
      uVar18 = SUB168(auVar62 * auVar12,8);
      uVar27 = SUB168(auVar62 * auVar12,0);
      auVar56._8_8_ = uVar2;
      auVar56._0_8_ = uVar28;
      uVar19 = *(ulong *)(puVar11 + (uVar34 ^ 0x20));
      uVar31 = *(ulong *)((long)(puVar11 + (uVar34 ^ 0x20)) + 8);
      uVar29 = *(ulong *)(puVar11 + (uVar34 ^ 0x10));
      uVar21 = *(ulong *)((long)(puVar11 + (uVar34 ^ 0x10)) + 8);
      lVar13 = *(long *)((long)(puVar11 + (uVar34 ^ 0x30)) + 8);
      *(ulong *)(puVar11 + (uVar34 ^ 0x10)) = uVar38 + *(long *)(puVar11 + (uVar34 ^ 0x30));
      *(ulong *)((long)(puVar11 + (uVar34 ^ 0x10)) + 8) = uVar39 + lVar13;
      *(ulong *)(puVar11 + (uVar34 ^ 0x20)) = (uVar18 ^ uVar29) + uVar40;
      *(ulong *)((long)(puVar11 + (uVar34 ^ 0x20)) + 8) = (uVar27 ^ uVar21) + uVar41;
      *(ulong *)(puVar11 + (uVar34 ^ 0x30)) = uVar19 + lVar57;
      *(ulong *)((long)(puVar11 + (uVar34 ^ 0x30)) + 8) = uVar31 + lVar59;
      auVar53._0_8_ = (uVar19 ^ uVar18) + lVar57;
      auVar53._8_8_ = (uVar31 ^ uVar27) + lVar59;
      auVar56 = auVar56 ^ auVar55;
      auVar58._8_8_ = uVar3;
      auVar58._0_8_ = uVar24;
      uVar22 = auVar43._0_8_;
      *(undefined1 (*) [16])(puVar11 + uVar34) = auVar53;
      uVar20 = auVar56._0_8_;
      auVar58 = auVar58 ^ auVar53;
      uVar16 = auVar58._0_8_;
      uVar25 = uVar25 - 1;
      auVar54 = auVar45;
      auVar60 = auVar61;
      auVar62 = auVar63;
      uVar19 = uVar47;
      uVar31 = uVar48;
      uVar38 = uVar40;
      uVar39 = uVar41;
    } while (uVar25 != 0);
  }
  lVar23 = 0;
  do {
    pcVar6 = ctx[lVar23];
    cn_implode_scratchpad<false>((__m128i *)pcVar6->memory,(__m128i *)pcVar6);
    keccakf((uint64_t *)pcVar6,0x18);
    (*(code *)(&extra_hashes)[(byte)*(longlong *)pcVar6->state & 3])(pcVar6,200,output);
    lVar23 = lVar23 + 1;
    output = output + 0x20;
  } while (lVar23 != 3);
  return;
}

Assistant:

inline void cryptonight_triple_hash(const uint8_t *__restrict__ input, size_t size, uint8_t *__restrict__ output, cryptonight_ctx **__restrict__ ctx, uint64_t height, uint64_t extra_iters)
{
    constexpr CnAlgo props;
    constexpr size_t MASK        = props.mask();

    uint32_t iters = (props.iterations() + extra_iters) >> 1;

    for (size_t i = 0; i < 3; i++) {
        keccak(input + size * i, size, ctx[i]->state);
        cn_explode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i*>(ctx[i]->state), reinterpret_cast<__m128i*>(ctx[i]->memory));
    }

    uint8_t* l0  = ctx[0]->memory;
    uint8_t* l1  = ctx[1]->memory;
    uint8_t* l2  = ctx[2]->memory;
    uint64_t* h0 = reinterpret_cast<uint64_t*>(ctx[0]->state);
    uint64_t* h1 = reinterpret_cast<uint64_t*>(ctx[1]->state);
    uint64_t* h2 = reinterpret_cast<uint64_t*>(ctx[2]->state);

    CONST_INIT(ctx[0], 0);
    CONST_INIT(ctx[1], 1);
    CONST_INIT(ctx[2], 2);
    VARIANT2_SET_ROUNDING_MODE();

    uint64_t idx0, idx1, idx2;
    idx0 = _mm_cvtsi128_si64(ax0);
    idx1 = _mm_cvtsi128_si64(ax1);
    idx2 = _mm_cvtsi128_si64(ax2);

    for (size_t i = 0; i < iters; i++) {
        uint64_t hi, lo;
        __m128i *ptr0, *ptr1, *ptr2;

        CN_STEP1(ax0, bx00, bx01, cx0, l0, ptr0, idx0);
        CN_STEP1(ax1, bx10, bx11, cx1, l1, ptr1, idx1);
        CN_STEP1(ax2, bx20, bx21, cx2, l2, ptr2, idx2);

        CN_STEP2(ax0, bx00, bx01, cx0, l0, ptr0, idx0);
        CN_STEP2(ax1, bx10, bx11, cx1, l1, ptr1, idx1);
        CN_STEP2(ax2, bx20, bx21, cx2, l2, ptr2, idx2);

        CN_STEP3(0, ax0, bx00, bx01, cx0, l0, ptr0, idx0);
        CN_STEP3(1, ax1, bx10, bx11, cx1, l1, ptr1, idx1);
        CN_STEP3(2, ax2, bx20, bx21, cx2, l2, ptr2, idx2);

        CN_STEP4(0, ax0, bx00, bx01, cx0, l0, mc0, ptr0, idx0);
        CN_STEP4(1, ax1, bx10, bx11, cx1, l1, mc1, ptr1, idx1);
        CN_STEP4(2, ax2, bx20, bx21, cx2, l2, mc2, ptr2, idx2);
    }

    for (size_t i = 0; i < 3; i++) {
        cn_implode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i*>(ctx[i]->memory), reinterpret_cast<__m128i*>(ctx[i]->state));
        keccakf(reinterpret_cast<uint64_t*>(ctx[i]->state), 24);
        extra_hashes[ctx[i]->state[0] & 3](ctx[i]->state, 200, output + 32 * i);
    }
}